

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O2

void __thiscall QFormLayoutPrivate::setupVerticalLayoutData(QFormLayoutPrivate *this,int width)

{
  QList<QLayoutStruct> *this_00;
  ItemMatrix *this_01;
  QLayout *this_02;
  long lVar1;
  QFormLayoutItem *item;
  QFormLayoutItem *item_00;
  bool recalculate;
  bool bVar2;
  byte bVar3;
  RowWrapPolicy RVar4;
  int userVSpacing;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  Alignment AVar10;
  pointer ppQVar11;
  QFormLayoutItem **ppQVar12;
  QSize QVar13;
  pointer pQVar14;
  QWidget *pQVar15;
  pointer pQVar16;
  QSize QVar17;
  ulong uVar18;
  QFormLayoutItem *prevItem1;
  Representation RVar19;
  long lVar20;
  ulong uVar21;
  Representation RVar22;
  byte local_c1;
  int local_c0;
  QFormLayoutItem *local_a0;
  QStyle *local_90;
  int local_78;
  int local_74;
  uint local_70;
  int local_6c;
  
  this_02 = *(QLayout **)&(this->super_QLayoutPrivate).field_0x8;
  if (((this->layoutWidth != width) &&
      (this->layoutWidth < this->thresh_width || width < this->thresh_width)) ||
     ((this->field_0xb2 & 0x3c) != 0)) {
    this->layoutWidth = width;
    uVar21 = (ulong)(this->m_matrix).m_storage.d.size >> 1;
    RVar4 = QFormLayout::rowWrapPolicy((QFormLayout *)this_02);
    this_00 = &this->vLayouts;
    QList<QLayoutStruct>::clear(this_00);
    iVar9 = (int)uVar21;
    QList<QLayoutStruct>::resize(this_00,(long)(iVar9 * 2 + 2));
    userVSpacing = QFormLayout::verticalSpacing((QFormLayout *)this_02);
    if ((userVSpacing < 0) && (pQVar15 = QLayout::parentWidget(this_02), pQVar15 != (QWidget *)0x0))
    {
      local_90 = QWidget::style(pQVar15);
    }
    else {
      local_90 = (QStyle *)0x0;
    }
    this_01 = &this->m_matrix;
    updateSizes(this);
    this->maxLabelWidth = 0;
    if (RVar4 == WrapAllRows) {
      this->maxLabelWidth = width;
      uVar21 = uVar21 & 0xffffffff;
      if (iVar9 < 1) {
        uVar21 = 0;
      }
    }
    else {
      uVar18 = 0;
      uVar21 = uVar21 & 0xffffffff;
      if (iVar9 < 1) {
        uVar21 = uVar18;
      }
      for (lVar20 = 0; uVar21 << 4 != lVar20; lVar20 = lVar20 + 0x10) {
        ppQVar11 = QList<QFormLayoutItem_*>::data(&this_01->m_storage);
        lVar1 = *(long *)((long)ppQVar11 + lVar20);
        ppQVar12 = QtPrivate::FixedColumnMatrix<QFormLayoutItem_*,_2>::operator()
                             (this_01,(int)uVar18,1);
        if (lVar1 != 0) {
          if (*ppQVar12 == (QFormLayoutItem *)0x0) {
            iVar9 = 0;
          }
          else {
            iVar9 = ((*ppQVar12)->minSize).wd.m_i;
          }
          iVar8 = *(int *)(lVar1 + 0x14);
          if (iVar9 + iVar8 <= width) {
            if (iVar8 < this->maxLabelWidth) {
              iVar8 = this->maxLabelWidth;
            }
            this->maxLabelWidth = iVar8;
          }
        }
        uVar18 = (ulong)((int)uVar18 + 1);
      }
    }
    uVar18 = 1;
    local_c1 = 1;
    iVar9 = 0;
    lVar20 = 0;
    prevItem1 = (QFormLayoutItem *)0x0;
    local_a0 = (QFormLayoutItem *)0x0;
    recalculate = false;
    while( true ) {
      local_c0 = (int)uVar18;
      if (uVar21 << 4 == lVar20) break;
      ppQVar11 = QList<QFormLayoutItem_*>::data(&this_01->m_storage);
      item = *(QFormLayoutItem **)((long)ppQVar11 + lVar20);
      ppQVar12 = QtPrivate::FixedColumnMatrix<QFormLayoutItem_*,_2>::operator()(this_01,iVar9,1);
      item_00 = *ppQVar12;
      bVar2 = QFormLayout::isRowVisible((QFormLayout *)this_02,iVar9);
      if (bVar2) {
        QVar13.wd.m_i = -1;
        QVar13.ht.m_i = 0;
        RVar19.m_i = -1;
        iVar8 = -1;
        if (item != (QFormLayoutItem *)0x0) {
          iVar8 = (item->minSize).ht.m_i;
          QVar13 = item->sizeHint;
          RVar19 = QVar13.ht.m_i;
        }
        iVar6 = -1;
        QVar17.wd.m_i = -1;
        QVar17.ht.m_i = 0;
        RVar22.m_i = iVar6;
        if (item_00 != (QFormLayoutItem *)0x0) {
          QVar17 = item_00->minSize;
          RVar22 = QVar17.ht.m_i;
          iVar6 = (item_00->sizeHint).ht.m_i;
        }
        if (RVar4 == WrapLongRows) {
          bVar2 = true;
          if (QVar13.wd.m_i.m_i <= this->maxLabelWidth) {
            bVar2 = width < this->maxLabelWidth + QVar17.wd.m_i.m_i;
            goto LAB_0037b24b;
          }
        }
        else {
          bVar2 = false;
LAB_0037b24b:
          if ((RVar4 != WrapAllRows) && (!bVar2)) {
            iVar7 = 0;
            if (item == (QFormLayoutItem *)0x0) {
              local_78 = 0;
              local_74 = 0xffffff;
              local_70 = 0;
            }
            else {
              local_74 = (item->maxSize).ht.m_i;
              uVar5 = (*item->item->_vptr_QLayoutItem[5])();
              local_70 = uVar5 >> 1 & 0x7f;
              item->sideBySide = item_00 != (QFormLayoutItem *)0x0;
              item->vLayoutIndex = local_c0;
              local_78 = QFormLayoutItem::vStretch(item);
            }
            if (item_00 == (QFormLayoutItem *)0x0) {
              local_6c = 0xffffff;
            }
            else {
              local_6c = (item_00->maxSize).ht.m_i;
              uVar5 = (*item_00->item->_vptr_QLayoutItem[5])();
              if ((uVar5 & 2) != 0) {
                local_70 = 1;
              }
              bVar3 = true;
              if (item == (QFormLayoutItem *)0x0) {
                bVar3 = item_00->fullRow ^ 1;
              }
              item_00->sideBySide = (bool)bVar3;
              item_00->vLayoutIndex = local_c0;
              iVar7 = QFormLayoutItem::vStretch(item_00);
            }
            pQVar14 = QList<QLayoutStruct>::data(this_00);
            if (iVar7 < local_78) {
              iVar7 = local_78;
            }
            if (RVar22.m_i < iVar8) {
              RVar22.m_i = iVar8;
            }
            pQVar14[local_c0].stretch = iVar7;
            pQVar14[local_c0].sizeHint = RVar22.m_i;
            pQVar14[local_c0].minimumSize = RVar22.m_i;
            pQVar14[local_c0].maximumSize = 0x7ffff;
            pQVar14[local_c0].expansive = false;
            pQVar14[local_c0].empty = true;
            pQVar14[local_c0].spacing = 0;
            if (iVar6 < RVar19.m_i) {
              iVar6 = RVar19.m_i;
            }
            pQVar14 = QList<QLayoutStruct>::data(this_00);
            pQVar14[local_c0].sizeHint = iVar6;
            if (local_74 < local_6c) {
              local_6c = local_74;
            }
            pQVar14 = QList<QLayoutStruct>::data(this_00);
            pQVar14[local_c0].maximumSize = local_6c;
            bVar2 = true;
            if ((local_70 & 1) == 0) {
              pQVar14 = QList<QLayoutStruct>::data(this_00);
              bVar2 = 0 < pQVar14[local_c0].stretch;
            }
            pQVar14 = QList<QLayoutStruct>::data(this_00);
            pQVar14[local_c0].expansive = bVar2;
            pQVar14 = QList<QLayoutStruct>::data(this_00);
            pQVar14[local_c0].empty = false;
            pQVar14 = QList<QLayoutStruct>::data(this_00);
            bVar2 = pQVar14[local_c0].expansive;
            if (1 < local_c0) {
              pQVar15 = QLayout::parentWidget(this_02);
              iVar8 = spacingHelper(pQVar15,local_90,userVSpacing,recalculate,item,item_00,prevItem1
                                    ,local_a0);
              pQVar14 = QList<QLayoutStruct>::data(this_00);
              pQVar14[uVar18 - 1].spacing = iVar8;
            }
            local_c1 = local_c1 & (bVar2 ^ 1U);
            local_a0 = item_00;
            if (item == (QFormLayoutItem *)0x0) {
              local_a0 = (QFormLayoutItem *)0x0;
              item = item_00;
            }
            uVar18 = (ulong)(local_c0 + 1);
            prevItem1 = item;
            bVar2 = false;
            goto LAB_0037b5f8;
          }
        }
        if (item != (QFormLayoutItem *)0x0) {
          pQVar14 = QList<QLayoutStruct>::data(this_00);
          initLayoutStruct(pQVar14 + local_c0,item);
          if (1 < local_c0) {
            pQVar15 = QLayout::parentWidget(this_02);
            iVar8 = spacingHelper(pQVar15,local_90,userVSpacing,(bool)(bVar2 | recalculate),item,
                                  (QFormLayoutItem *)0x0,prevItem1,local_a0);
            pQVar14 = QList<QLayoutStruct>::data(this_00);
            pQVar14[uVar18 - 1].spacing = iVar8;
          }
          item->vLayoutIndex = local_c0;
          item->sideBySide = false;
          pQVar14 = QList<QLayoutStruct>::data(this_00);
          local_c1 = local_c1 & pQVar14[local_c0].stretch < 1;
          uVar18 = (ulong)(local_c0 + 1);
          local_a0 = (QFormLayoutItem *)0x0;
          prevItem1 = item;
        }
        if (item_00 != (QFormLayoutItem *)0x0) {
          iVar8 = (int)uVar18;
          pQVar14 = QList<QLayoutStruct>::data(this_00);
          initLayoutStruct(pQVar14 + iVar8,item_00);
          if (1 < iVar8) {
            pQVar15 = QLayout::parentWidget(this_02);
            iVar6 = spacingHelper(pQVar15,local_90,userVSpacing,(bool)(bVar2 | recalculate),item_00,
                                  (QFormLayoutItem *)0x0,prevItem1,local_a0);
            pQVar14 = QList<QLayoutStruct>::data(this_00);
            pQVar14[uVar18 - 1].spacing = iVar6;
          }
          item_00->vLayoutIndex = iVar8;
          item_00->sideBySide = false;
          pQVar14 = QList<QLayoutStruct>::data(this_00);
          local_c1 = local_c1 & pQVar14[iVar8].stretch < 1;
          local_a0 = (QFormLayoutItem *)0x0;
          uVar18 = (ulong)(iVar8 + 1);
          prevItem1 = item_00;
        }
      }
      else {
        if (item != (QFormLayoutItem *)0x0) {
          item->vLayoutIndex = -1;
        }
        bVar2 = recalculate;
        if (item_00 != (QFormLayoutItem *)0x0) {
          item_00->vLayoutIndex = -1;
        }
      }
LAB_0037b5f8:
      lVar20 = lVar20 + 0x10;
      iVar9 = iVar9 + 1;
      recalculate = bVar2;
    }
    if (local_c1 == 0) {
      pQVar14 = QList<QLayoutStruct>::data(this_00);
      pQVar14->stretch = 0;
      pQVar14->sizeHint = 0;
      pQVar14->maximumSize = 0x7ffff;
      pQVar14->minimumSize = 0;
      pQVar14->expansive = false;
      pQVar14->empty = true;
      pQVar14->spacing = 0;
    }
    else {
      AVar10 = QFormLayout::formAlignment((QFormLayout *)this_02);
      if (((uint)AVar10.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                 super_QFlagsStorage<Qt::AlignmentFlag>.i & 0x40) == 0) {
        pQVar16 = QList<QLayoutStruct>::data(this_00);
        pQVar14 = pQVar16 + local_c0;
        pQVar14->stretch = 1;
        pQVar14->sizeHint = 0;
        pQVar14->maximumSize = 0x7ffff;
        pQVar14->minimumSize = 0;
        pQVar16[local_c0].expansive = false;
        pQVar16[local_c0].empty = true;
        pQVar16[local_c0].spacing = 0;
        pQVar14 = QList<QLayoutStruct>::data(this_00);
        pQVar14[local_c0].expansive = true;
        local_c0 = local_c0 + 1;
      }
      pQVar14 = QList<QLayoutStruct>::data(this_00);
      if (((uint)AVar10.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                 super_QFlagsStorage<Qt::AlignmentFlag>.i & 0xc0) == 0) {
        pQVar14->stretch = 0;
        pQVar14->sizeHint = 0;
        pQVar14->maximumSize = 0x7ffff;
        pQVar14->minimumSize = 0;
        pQVar14->expansive = false;
        pQVar14->empty = true;
        pQVar14->spacing = 0;
      }
      else {
        pQVar14->stretch = 1;
        pQVar14->sizeHint = 0;
        pQVar14->maximumSize = 0x7ffff;
        pQVar14->minimumSize = 0;
        pQVar14->expansive = false;
        pQVar14->empty = true;
        pQVar14->spacing = 0;
        pQVar14 = QList<QLayoutStruct>::data(this_00);
        pQVar14->expansive = true;
      }
    }
    this->vLayoutCount = local_c0;
    this->field_0xb2 = this->field_0xb2 & 0xf3;
  }
  return;
}

Assistant:

void QFormLayoutPrivate::setupVerticalLayoutData(int width)
{
    Q_Q(QFormLayout);

    // Early out if we have no changes that would cause a change in vertical layout
    if ((width == layoutWidth || (width >= thresh_width && layoutWidth >= thresh_width)) && !dirty && !sizesDirty)
        return;

    layoutWidth = width;

    int rr = m_matrix.rowCount();
    int vidx = 1;
    QFormLayout::RowWrapPolicy rowWrapPolicy = q->rowWrapPolicy();
    bool wrapAllRows = (rowWrapPolicy == QFormLayout::WrapAllRows);
    bool addTopBottomStretch = true;

    vLayouts.clear();
    vLayouts.resize((2 * rr) + 2); // a max, some may be unused

    QStyle *style = nullptr;

    int userVSpacing = q->verticalSpacing();

    if (userVSpacing < 0) {
        if (QWidget *widget = q->parentWidget())
            style = widget->style();
    }

    // make sure our sizes are up to date
    updateSizes();

    // Grab the widest label width here
    // This might be different from the value computed during
    // sizeHint/minSize, since we don't count label/field pairs that
    // are split.
    maxLabelWidth = 0;
    if (!wrapAllRows) {
        for (int i = 0; i < rr; ++i) {
            const QFormLayoutItem *label = m_matrix(i, 0);
            const QFormLayoutItem *field = m_matrix(i, 1);
            if (label && (label->sizeHint.width() + (field ? field->minSize.width() : 0) <= width))
                maxLabelWidth = qMax(maxLabelWidth, label->sizeHint.width());
        }
    } else {
        maxLabelWidth = width;
    }

    QFormLayoutItem *prevItem1 = nullptr;
    QFormLayoutItem *prevItem2 = nullptr;
    bool prevRowSplit = false;

    for (int i = 0; i < rr; ++i) {
        QFormLayoutItem *label = m_matrix(i, 0);
        QFormLayoutItem *field = m_matrix(i, 1);

        // Ignore empty rows or rows with only hidden items,
        // and invalidate their position in the layout.
        if (!q->isRowVisible(i)) {
            if (label)
                label->vLayoutIndex = -1;
            if (field)
                field->vLayoutIndex = -1;
            continue;
        }

        QSize min1;
        QSize min2;
        QSize sh1;
        QSize sh2;
        if (label) {
            min1 = label->minSize;
            sh1 = label->sizeHint;
        }
        if (field) {
            min2 = field->minSize;
            sh2 = field->sizeHint;
        }

        // In separate lines, we make a vLayout for everything that isn't null
        // in side by side, we only separate label/field if we're going to wrap it
        bool splitSideBySide = (rowWrapPolicy == QFormLayout::WrapLongRows)
                                && ((maxLabelWidth < sh1.width()) || (width < (maxLabelWidth + min2.width())));

        if (wrapAllRows || splitSideBySide) {
            if (label) {
                initLayoutStruct(vLayouts[vidx], label);

                if (vidx > 1)
                    vLayouts[vidx - 1].spacing = spacingHelper(q->parentWidget(), style, userVSpacing, splitSideBySide || prevRowSplit, label, nullptr, prevItem1, prevItem2);

                label->vLayoutIndex = vidx;
                label->sideBySide = false;

                prevItem1 = label;
                prevItem2 = nullptr;

                if (vLayouts[vidx].stretch > 0)
                    addTopBottomStretch = false;

                ++vidx;
            }

            if (field) {
                initLayoutStruct(vLayouts[vidx], field);

                if (vidx > 1)
                    vLayouts[vidx - 1].spacing = spacingHelper(q->parentWidget(), style, userVSpacing, splitSideBySide || prevRowSplit, field, nullptr, prevItem1, prevItem2);

                field->vLayoutIndex = vidx;
                field->sideBySide = false;

                prevItem1 = field;
                prevItem2 = nullptr;

                if (vLayouts[vidx].stretch > 0)
                    addTopBottomStretch = false;

                ++vidx;
            }

            prevRowSplit = splitSideBySide;
        } else {
            // we're in side by side mode, and we have enough space to do that
            QSize max1(QWIDGETSIZE_MAX, QWIDGETSIZE_MAX);
            QSize max2(QWIDGETSIZE_MAX, QWIDGETSIZE_MAX);

            int stretch1 = 0;
            int stretch2 = 0;
            bool expanding = false;

            if (label) {
                max1 = label->maxSize;
                if (label->expandingDirections() & Qt::Vertical)
                    expanding = true;

                label->sideBySide = (field != nullptr);
                label->vLayoutIndex = vidx;
                stretch1 = label->vStretch();
            }

            if (field) {
                max2 = field->maxSize;
                if (field->expandingDirections() & Qt::Vertical)
                    expanding = true;

                field->sideBySide = (label || !field->fullRow);
                field->vLayoutIndex = vidx;
                stretch2 = field->vStretch();
            }

            vLayouts[vidx].init(qMax(stretch1, stretch2), qMax(min1.height(), min2.height()));
            vLayouts[vidx].sizeHint = qMax(sh1.height(), sh2.height());
            vLayouts[vidx].maximumSize = qMin(max1.height(), max2.height());
            vLayouts[vidx].expansive = expanding || (vLayouts[vidx].stretch > 0);
            vLayouts[vidx].empty = false;

            if (vLayouts[vidx].expansive)
                addTopBottomStretch = false;

            if (vidx > 1)
                vLayouts[vidx - 1].spacing = spacingHelper(q->parentWidget(), style, userVSpacing, prevRowSplit, label, field, prevItem1, prevItem2);

            if (label) {
                prevItem1 = label;
                prevItem2 = field;
            } else {
                prevItem1 = field;
                prevItem2 = nullptr;
            }

            prevRowSplit = false;
            ++vidx;
        }
    }

    if (addTopBottomStretch) {
        Qt::Alignment formAlignment = q->formAlignment();

        if (!(formAlignment & Qt::AlignBottom)) {
            // AlignTop (default if unspecified) or AlignVCenter: We add a stretch at the bottom
            vLayouts[vidx].init(1, 0);
            vLayouts[vidx].expansive = true;
            ++vidx;
        }

        if (formAlignment & (Qt::AlignVCenter | Qt::AlignBottom)) {
            // AlignVCenter or AlignBottom: We add a stretch at the top
            vLayouts[0].init(1, 0);
            vLayouts[0].expansive = true;
        } else {
            vLayouts[0].init(0, 0);
        }
    } else {
        vLayouts[0].init(0, 0);
    }

    vLayoutCount = vidx;
    dirty = false;
}